

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

ItemSimilarityRecommender_SimilarItems *
google::protobuf::internal::
GenericTypeHandler<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::New(Arena *arena)

{
  Arena *arena_local;
  ItemSimilarityRecommender_SimilarItems *local_28;
  ItemSimilarityRecommender_SimilarItems *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (ItemSimilarityRecommender_SimilarItems *)operator_new(0x40);
    CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
    ItemSimilarityRecommender_SimilarItems(local_28);
  }
  else {
    local_28 = (ItemSimilarityRecommender_SimilarItems *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
                                 typeinfo,0x40);
    CoreML::Specification::ItemSimilarityRecommender_SimilarItems::
    ItemSimilarityRecommender_SimilarItems(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                      );
  }
  return local_28;
}

Assistant:

static inline GenericType* New(Arena* arena) {
    return ::google::protobuf::Arena::CreateMaybeMessage<Type>(
        arena, static_cast<GenericType*>(0));
  }